

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::Rehash(SQTable *this,bool force)

{
  _HashNode *p;
  SQInteger SVar1;
  _HashNode *val;
  long local_48;
  SQInteger k;
  _HashNode *old;
  SQInteger i;
  SQInteger nelems;
  _HashNode *nold;
  SQInteger oldsize;
  bool force_local;
  SQTable *this_local;
  
  nold = (_HashNode *)this->_numofnodes;
  if ((long)nold < 4) {
    nold = (_HashNode *)0x4;
  }
  p = this->_nodes;
  SVar1 = CountUsed(this);
  if (SVar1 < (long)nold - (long)nold / 4) {
    if (((long)nold / 4 < SVar1) || ((long)nold < 5)) {
      if (!force) {
        return;
      }
      AllocNodes(this,(SQInteger)nold);
    }
    else {
      AllocNodes(this,(long)nold / 2);
    }
  }
  else {
    AllocNodes(this,(long)nold << 1);
  }
  this->_usednodes = 0;
  for (old = (_HashNode *)0x0; (long)old < (long)nold;
      old = (_HashNode *)((long)&(old->val).super_SQObject._type + 1)) {
    val = p + (long)old;
    if ((val->key).super_SQObject._type != OT_NULL) {
      NewSlot(this,&val->key,&val->val);
    }
  }
  for (local_48 = 0; local_48 < (long)nold; local_48 = local_48 + 1) {
    _HashNode::~_HashNode(p + local_48);
  }
  sq_vm_free(p,(long)nold * 0x28);
  return;
}

Assistant:

void SQTable::Rehash(bool force)
{
    SQInteger oldsize=_numofnodes;
    //prevent problems with the integer division
    if(oldsize<4)oldsize=4;
    _HashNode *nold=_nodes;
    SQInteger nelems=CountUsed();
    if (nelems >= oldsize-oldsize/4)  /* using more than 3/4? */
        AllocNodes(oldsize*2);
    else if (nelems <= oldsize/4 &&  /* less than 1/4? */
        oldsize > MINPOWER2)
        AllocNodes(oldsize/2);
    else if(force)
        AllocNodes(oldsize);
    else
        return;
    _usednodes = 0;
    for (SQInteger i=0; i<oldsize; i++) {
        _HashNode *old = nold+i;
        if (type(old->key) != OT_NULL)
            NewSlot(old->key,old->val);
    }
    for(SQInteger k=0;k<oldsize;k++)
        nold[k].~_HashNode();
    SQ_FREE(nold,oldsize*sizeof(_HashNode));
}